

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

void __thiscall RegressionTree::~RegressionTree(RegressionTree *this)

{
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__RegressionTree_0021ea70;
  if (this->_queryRootIndex != (size_t *)0x0) {
    operator_delete__(this->_queryRootIndex);
  }
  if (this->_numOfCandidates != (size_t *)0x0) {
    operator_delete__(this->_numOfCandidates);
  }
  if (this->_complementFunction != (size_t *)0x0) {
    operator_delete__(this->_complementFunction);
  }
  std::_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~_Vector_base
            (&(this->_candidateMask).
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_varOfFunction).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
            (&(this->_functionOfAggregate).
              super__Vector_base<Function_*,_std::allocator<Function_*>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->_thresholds);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->_pathToFiles);
  Application::~Application(&this->super_Application);
  return;
}

Assistant:

RegressionTree::~RegressionTree()
{
    delete[] _queryRootIndex;
    delete[] _numOfCandidates;
    delete[] _complementFunction;
}